

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineStencilTests.cpp
# Opt level: O3

TestCaseGroup * vkt::pipeline::createStencilTests(TestContext *testCtx)

{
  VkStencilOp *pVVar1;
  VkFormat value;
  char *pcVar2;
  long *plVar3;
  ostream *poVar4;
  TestNode *this;
  TestNode *pTVar5;
  size_type *psVar6;
  VkStencilOpState *pVVar7;
  float *pfVar8;
  int quadNdx;
  long lVar9;
  VkStencilOpState prevStencilState;
  VkStencilOpState stencilState;
  VkStencilOpState firstStencilState;
  string fullName;
  string local_280;
  TestNode *local_260;
  TestContext *local_258;
  VkFormat local_24c;
  TestNode *local_248;
  TestNode *local_240;
  string local_238;
  UniqueRandomIterator<vk::VkStencilOpState> local_218;
  long local_1f0;
  VkStencilOp local_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  VkStencilOp local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_248 = (TestNode *)operator_new(0x70);
  local_258 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)local_248,testCtx,"stencil","Stencil tests");
  local_260 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_260,local_258,"format","Uses different stencil formats");
  UniqueRandomIterator<vk::VkStencilOpState>::UniqueRandomIterator(&local_218,0x1000,0x1000,0x7b);
  local_218._vptr_UniqueRandomIterator = (_func_int **)&PTR__UniqueRandomIterator_00d29f30;
  lVar9 = 0;
  do {
    value = FragmentOperations::anon_unknown_1::EarlyFragmentTestInstance::iterate::stencilFormats
            [lVar9];
    local_240 = (TestNode *)operator_new(0x70);
    pcVar2 = ::vk::getFormatName(value);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,pcVar2,(allocator<char> *)&local_280);
    std::__cxx11::string::substr((ulong)&local_280,(ulong)local_1a8);
    de::toLower(&local_238,&local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    pcVar2 = (char *)CONCAT44(local_238._M_dataplus._M_p._4_4_,
                              (VkStencilOp)local_238._M_dataplus._M_p);
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"Uses format ","");
    ::vk::getFormatName(value);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_280);
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    psVar6 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_1a8[0].field_2._0_8_ = *psVar6;
      local_1a8[0].field_2._8_8_ = plVar3[3];
    }
    else {
      local_1a8[0].field_2._0_8_ = *psVar6;
      local_1a8[0]._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_1a8[0]._M_string_length = plVar3[1];
    *plVar3 = (long)psVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)local_240,local_258,pcVar2,local_1a8[0]._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_238._M_dataplus._M_p._4_4_,(VkStencilOp)local_238._M_dataplus._M_p) !=
        &local_238.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_238._M_dataplus._M_p._4_4_,
                               (VkStencilOp)local_238._M_dataplus._M_p),
                      CONCAT44(local_238.field_2._M_allocated_capacity._4_4_,
                               local_238.field_2._M_allocated_capacity._0_4_) + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    local_24c = value;
    local_1f0 = lVar9;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Draws 4 quads with the following depths and dynamic stencil states: ",0x44);
    pfVar8 = (float *)&(anonymous_namespace)::StencilTest::s_quadDepths;
    lVar9 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"(",1);
      poVar4 = (ostream *)std::ostream::operator<<(local_1a8,(int)lVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"z = ",4);
      poVar4 = std::ostream::_M_insert<double>((double)*pfVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"frontReadMask = ",0x10);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"frontWriteMask = ",0x11);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"frontRef = ",0xb);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"backReadMask = ",0xf);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"backWriteMask = ",0x10);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"backRef = ",10);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      lVar9 = lVar9 + 1;
      pfVar8 = pfVar8 + 1;
    } while (lVar9 != 4);
    this = (TestNode *)operator_new(0x70);
    std::__cxx11::stringbuf::str();
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)this,local_258,"states",local_280._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    local_218.m_currentIndex = 1;
    (*local_218._vptr_UniqueRandomIterator[2])
              (&local_238,&local_218,
               (ulong)*local_218.m_indices.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start);
    uStack_1b8 = local_238.field_2._M_allocated_capacity._0_4_;
    uStack_1b4 = local_238.field_2._M_allocated_capacity._4_4_;
    uStack_1b0 = local_238.field_2._8_4_;
    local_1c8 = (VkStencilOp)local_238._M_dataplus._M_p;
    uStack_1c4 = local_238._M_dataplus._M_p._4_4_;
    uStack_1c0 = (undefined4)local_238._M_string_length;
    uStack_1bc = local_238._M_string_length._4_4_;
    while( true ) {
      if ((ulong)((long)local_218.m_indices.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_218.m_indices.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) <= local_218.m_currentIndex) break;
      pVVar1 = local_218.m_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start + local_218.m_currentIndex;
      pVVar7 = (VkStencilOpState *)
               local_218.m_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_218.m_currentIndex = local_218.m_currentIndex + 1;
      (*local_218._vptr_UniqueRandomIterator[2])(&local_1e4,&local_218,(ulong)*pVVar1);
      pTVar5 = (TestNode *)operator_new(0xb0);
      (anonymous_namespace)::getStencilStateSetName_abi_cxx11_
                (local_1a8,(_anonymous_namespace_ *)&local_1e4,(VkStencilOpState *)&local_238,pVVar7
                );
      (anonymous_namespace)::getStencilStateSetDescription_abi_cxx11_
                (&local_280,(_anonymous_namespace_ *)&local_1e4,(VkStencilOpState *)&local_238,
                 pVVar7);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar5,local_258,local_1a8[0]._M_dataplus._M_p,
                 local_280._M_dataplus._M_p);
      pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d29f70;
      *(VkFormat *)&pTVar5[1]._vptr_TestNode = local_24c;
      *(ulong *)((long)&pTVar5[1]._vptr_TestNode + 4) = CONCAT44(uStack_1e0,local_1e4);
      *(ulong *)((long)&pTVar5[1].m_testCtx + 4) = CONCAT44(uStack_1d8,uStack_1dc);
      pTVar5[1].m_name._M_dataplus._M_p = (pointer)CONCAT44(uStack_1d4,uStack_1d8);
      pTVar5[1].m_name._M_string_length = CONCAT44(uStack_1cc,uStack_1d0);
      pTVar5[1].m_name.field_2._M_allocated_capacity =
           CONCAT44(local_238._M_dataplus._M_p._4_4_,(VkStencilOp)local_238._M_dataplus._M_p);
      *(ulong *)((long)&pTVar5[1].m_name.field_2 + 8) =
           CONCAT44(local_238._M_string_length._4_4_,(undefined4)local_238._M_string_length);
      *(ulong *)((long)&pTVar5[1].m_name.field_2 + 0xc) =
           CONCAT44(local_238.field_2._M_allocated_capacity._0_4_,local_238._M_string_length._4_4_);
      *(ulong *)((long)&pTVar5[1].m_description._M_dataplus._M_p + 4) =
           CONCAT44(local_238.field_2._8_4_,local_238.field_2._M_allocated_capacity._4_4_);
      tcu::TestNode::addChild(this,pTVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      local_238._M_dataplus._M_p._0_4_ = local_1e4;
      local_238._M_dataplus._M_p._4_4_ = uStack_1e0;
      local_238._M_string_length._0_4_ = uStack_1dc;
      local_238._M_string_length._4_4_ = uStack_1d8;
      local_238.field_2._M_allocated_capacity._0_4_ = uStack_1d4;
      local_238.field_2._M_allocated_capacity._4_4_ = uStack_1d0;
      local_238.field_2._8_4_ = uStack_1cc;
    }
    pVVar7 = (VkStencilOpState *)
             local_218.m_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pTVar5 = (TestNode *)operator_new(0xb0);
    (anonymous_namespace)::getStencilStateSetName_abi_cxx11_
              (local_1a8,(_anonymous_namespace_ *)&local_1c8,(VkStencilOpState *)&local_238,pVVar7);
    (anonymous_namespace)::getStencilStateSetDescription_abi_cxx11_
              (&local_280,(_anonymous_namespace_ *)&local_1c8,(VkStencilOpState *)&local_238,pVVar7)
    ;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar5,local_258,local_1a8[0]._M_dataplus._M_p,local_280._M_dataplus._M_p
              );
    pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d29f70;
    *(VkFormat *)&pTVar5[1]._vptr_TestNode = local_24c;
    *(ulong *)((long)&pTVar5[1]._vptr_TestNode + 4) = CONCAT44(uStack_1c4,local_1c8);
    *(ulong *)((long)&pTVar5[1].m_testCtx + 4) = CONCAT44(uStack_1bc,uStack_1c0);
    pTVar5[1].m_name._M_dataplus._M_p = (pointer)CONCAT44(uStack_1b8,uStack_1bc);
    pTVar5[1].m_name._M_string_length = CONCAT44(uStack_1b0,uStack_1b4);
    pTVar5[1].m_name.field_2._M_allocated_capacity =
         CONCAT44(local_238._M_dataplus._M_p._4_4_,(VkStencilOp)local_238._M_dataplus._M_p);
    *(ulong *)((long)&pTVar5[1].m_name.field_2 + 8) =
         CONCAT44(local_238._M_string_length._4_4_,(undefined4)local_238._M_string_length);
    *(ulong *)((long)&pTVar5[1].m_name.field_2 + 0xc) =
         CONCAT44(local_238.field_2._M_allocated_capacity._0_4_,local_238._M_string_length._4_4_);
    *(ulong *)((long)&pTVar5[1].m_description._M_dataplus._M_p + 4) =
         CONCAT44(local_238.field_2._8_4_,local_238.field_2._M_allocated_capacity._4_4_);
    tcu::TestNode::addChild(this,pTVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    lVar9 = local_1f0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    pTVar5 = local_240;
    tcu::TestNode::addChild(local_240,this);
    tcu::TestNode::addChild(local_260,pTVar5);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  tcu::TestNode::addChild(local_248,local_260);
  local_218._vptr_UniqueRandomIterator = (_func_int **)&PTR__UniqueRandomIterator_00d2a060;
  if ((VkStencilOpState *)
      local_218.m_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (VkStencilOpState *)0x0) {
    operator_delete(local_218.m_indices.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_218.m_indices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_218.m_indices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (TestCaseGroup *)local_248;
}

Assistant:

tcu::TestCaseGroup* createStencilTests (tcu::TestContext& testCtx)
{
	const VkFormat stencilFormats[] =
	{
		VK_FORMAT_S8_UINT,
		VK_FORMAT_D16_UNORM_S8_UINT,
		VK_FORMAT_D24_UNORM_S8_UINT,
		VK_FORMAT_D32_SFLOAT_S8_UINT
	};

	de::MovePtr<tcu::TestCaseGroup>		stencilTests	(new tcu::TestCaseGroup(testCtx, "stencil", "Stencil tests"));
	de::MovePtr<tcu::TestCaseGroup>		formatTests		(new tcu::TestCaseGroup(testCtx, "format", "Uses different stencil formats"));
	StencilOpStateUniqueRandomIterator	stencilOpItr	(123);

	for (size_t formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(stencilFormats); formatNdx++)
	{
		const VkFormat					stencilFormat	= stencilFormats[formatNdx];
		de::MovePtr<tcu::TestCaseGroup>	formatTest		(new tcu::TestCaseGroup(testCtx,
																				getFormatCaseName(stencilFormat).c_str(),
																				(std::string("Uses format ") + getFormatName(stencilFormat)).c_str()));

		de::MovePtr<tcu::TestCaseGroup>	stencilStateTests;
		{
			std::ostringstream desc;
			desc << "Draws 4 quads with the following depths and dynamic stencil states: ";
			for (int quadNdx = 0; quadNdx < StencilTest::QUAD_COUNT; quadNdx++)
			{
				const StencilTest::StencilStateConfig& stencilConfig = StencilTest::s_stencilStateConfigs[quadNdx];

				desc << "(" << quadNdx << ") "
					 << "z = " << StencilTest::s_quadDepths[quadNdx] << ", "
					 << "frontReadMask = " << stencilConfig.frontReadMask << ", "
					 << "frontWriteMask = " << stencilConfig.frontWriteMask << ", "
					 << "frontRef = " << stencilConfig.frontRef << ", "
					 << "backReadMask = " << stencilConfig.backReadMask << ", "
					 << "backWriteMask = " << stencilConfig.backWriteMask << ", "
					 << "backRef = " << stencilConfig.backRef;
			}

			stencilStateTests = de::MovePtr<tcu::TestCaseGroup>(new tcu::TestCaseGroup(testCtx, "states", desc.str().c_str()));
		}

		stencilOpItr.reset();

		VkStencilOpState		prevStencilState	= stencilOpItr.next();
		const VkStencilOpState	firstStencilState	= prevStencilState;

		while (stencilOpItr.hasNext())
		{
			const VkStencilOpState stencilState = stencilOpItr.next();

			// Use current stencil state in front fraces and previous state in back faces
			stencilStateTests->addChild(new StencilTest(testCtx,
														getStencilStateSetName(stencilState, prevStencilState),
														getStencilStateSetDescription(stencilState, prevStencilState),
														stencilFormat,
														stencilState,
														prevStencilState));

			prevStencilState = stencilState;
		}

		// Use first stencil state with last stencil state. This would make the test suite cover all states in front and back faces.
		stencilStateTests->addChild(new StencilTest(testCtx,
													getStencilStateSetName(firstStencilState, prevStencilState),
													getStencilStateSetDescription(firstStencilState, prevStencilState),
													stencilFormat,
													firstStencilState,
													prevStencilState));

		formatTest->addChild(stencilStateTests.release());
		formatTests->addChild(formatTest.release());
	}
	stencilTests->addChild(formatTests.release());

	return stencilTests.release();
}